

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::insert_move(Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
              *this,Node *keyval)

{
  Vector2i *pVVar1;
  undefined8 *puVar2;
  InfoType IVar3;
  Node *pNVar4;
  byte *pbVar5;
  Vector2i VVar6;
  int iVar7;
  undefined4 uVar8;
  InfoType IVar9;
  size_t insertion_idx;
  bool bVar10;
  long lVar11;
  long lVar12;
  InfoType info;
  size_t idx;
  InfoType local_34;
  size_t local_30;
  
  if (this->mMaxNumElementsAllowed == 0) {
    bVar10 = try_increase_info(this);
    if (!bVar10) {
      throwOverflowError(this);
    }
  }
  local_30 = 0;
  local_34 = 0;
  Table<true,80ul,Rml::Character,Rml::FontGlyph,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>
  ::keyToIdx<Rml::Character&>
            ((Table<true,80ul,Rml::Character,Rml::FontGlyph,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>
              *)this,(Character *)keyval,&local_30,&local_34);
  IVar3 = this->mInfoInc;
  lVar11 = local_30 * 0x38;
  for (; insertion_idx = local_30, IVar9 = local_34, local_34 <= this->mInfo[local_30];
      local_34 = local_34 + IVar3) {
    local_30 = local_30 + 1;
    lVar11 = lVar11 + 0x38;
  }
  if (0xff < (local_34 & 0xff) + IVar3) {
    this->mMaxNumElementsAllowed = 0;
  }
  lVar12 = 0;
  for (; this->mInfo[local_30] != '\0'; local_30 = local_30 + 1) {
    lVar12 = lVar12 + -1;
    local_34 = IVar3 + local_34;
  }
  pNVar4 = this->mKeyVals;
  if (lVar12 == 0) {
    *(Character *)((long)&(pNVar4->mData).first + lVar11) = (keyval->mData).first;
    iVar7 = (keyval->mData).second.advance;
    uVar8 = *(undefined4 *)&(keyval->mData).second.field_0xc;
    pbVar5 = (keyval->mData).second.bitmap_data;
    VVar6 = (keyval->mData).second.bitmap_dimensions;
    pVVar1 = (Vector2i *)((long)&(pNVar4->mData).second.bearing.x + lVar11);
    *pVVar1 = (keyval->mData).second.bearing;
    pVVar1[1].x = iVar7;
    pVVar1[1].y = uVar8;
    puVar2 = (undefined8 *)((long)&(pNVar4->mData).second.bitmap_data + lVar11);
    *puVar2 = pbVar5;
    *(Vector2i *)(puVar2 + 1) = VVar6;
    *(ColorFormat *)((long)&(pNVar4->mData).second.color_format + lVar11) =
         (keyval->mData).second.color_format;
    *(uchar **)
     ((long)&(pNVar4->mData).second.bitmap_owned_data._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t +
     lVar11) = (keyval->mData).second.bitmap_owned_data._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (keyval->mData).second.bitmap_owned_data._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  }
  else {
    shiftUp(this,local_30,insertion_idx);
    pair<Rml::Character,_Rml::FontGlyph>::operator=
              ((pair<Rml::Character,_Rml::FontGlyph> *)((long)&(pNVar4->mData).first + lVar11),
               &keyval->mData);
  }
  this->mInfo[insertion_idx] = (uint8_t)IVar9;
  this->mNumElements = this->mNumElements + 1;
  return insertion_idx;
}

Assistant:

size_t insert_move(Node&& keyval) {
        // we don't retry, fail if overflowing
        // don't need to check max num elements
        if (0 == mMaxNumElementsAllowed && !try_increase_info()) {
            throwOverflowError(); // impossible to reach LCOV_EXCL_LINE
        }

        size_t idx{};
        InfoType info{};
        keyToIdx(keyval.getFirst(), &idx, &info);

        // skip forward. Use <= because we are certain that the element is not there.
        while (info <= mInfo[idx]) {
            idx = idx + 1;
            info += mInfoInc;
        }

        // key not found, so we are now exactly where we want to insert it.
        auto const insertion_idx = idx;
        auto const insertion_info = static_cast<uint8_t>(info);
        if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
            mMaxNumElementsAllowed = 0;
        }

        // find an empty spot
        while (0 != mInfo[idx]) {
            next(&info, &idx);
        }

        auto& l = mKeyVals[insertion_idx];
        if (idx == insertion_idx) {
            ::new (static_cast<void*>(&l)) Node(std::move(keyval));
        } else {
            shiftUp(idx, insertion_idx);
            l = std::move(keyval);
        }

        // put at empty spot
        mInfo[insertion_idx] = insertion_info;

        ++mNumElements;
        return insertion_idx;
    }